

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::validate(CommandLine<Catch::ConfigData> *this)

{
  bool bVar1;
  element_type *peVar2;
  logic_error *this_00;
  pointer this_01;
  __normal_iterator<const_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
  local_58;
  const_iterator itEnd;
  const_iterator it;
  allocator local_31;
  string local_30 [32];
  CommandLine<Catch::ConfigData> *local_10;
  CommandLine<Catch::ConfigData> *this_local;
  
  local_10 = this;
  bVar1 = std::
          vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
          ::empty(&this->m_options);
  if (((bVar1) &&
      (bVar1 = std::
               map<int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::less<int>,_std::allocator<std::pair<const_int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
               ::empty(&this->m_positionalArgs), bVar1)) &&
     (peVar2 = std::auto_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>::get
                         (&this->m_floatingArg), peVar2 == (element_type *)0x0)) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"No options or arguments specified",&local_31);
    std::logic_error::logic_error(this_00,local_30);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  itEnd = std::
          vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
          ::begin(&this->m_options);
  local_58._M_current =
       (Arg *)std::
              vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
              ::end(&this->m_options);
  while (bVar1 = __gnu_cxx::operator!=(&itEnd,&local_58), bVar1) {
    this_01 = __gnu_cxx::
              __normal_iterator<const_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
              ::operator->(&itEnd);
    CommonArgProperties<Catch::ConfigData>::validate
              (&this_01->super_CommonArgProperties<Catch::ConfigData>);
    __gnu_cxx::
    __normal_iterator<const_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
    ::operator++(&itEnd);
  }
  return;
}

Assistant:

void validate() const
        {
            if( m_options.empty() && m_positionalArgs.empty() && !m_floatingArg.get() )
                throw std::logic_error( "No options or arguments specified" );

            for( typename std::vector<Arg>::const_iterator  it = m_options.begin(),
                                                            itEnd = m_options.end();
                    it != itEnd; ++it )
                it->validate();
        }